

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int vs_vlc(bitstream *str,uint32_t *val,vs_vlc_val *tab)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  vs_vlc_val *pvVar8;
  int local_d0;
  uint32_t bit [32];
  
  if (str->dir == VS_ENCODE) {
    piVar7 = &tab->blen;
    do {
      piVar6 = piVar7;
      if (*piVar6 == 0) {
        fwrite("No VLC code for a value\n",0x18,1,_stderr);
        goto LAB_00101987;
      }
      piVar7 = piVar6 + 0x22;
    } while (*val != ((vs_vlc_val *)(piVar6 + -1))->val);
    lVar3 = 0;
    piVar7 = piVar6;
    do {
      piVar7 = piVar7 + 1;
      if (*piVar6 <= lVar3) {
        return 0;
      }
      bit[0] = *piVar7;
      iVar1 = vs_u(str,bit,1);
      lVar3 = lVar3 + 1;
    } while (iVar1 == 0);
LAB_00101987:
    local_d0 = 1;
  }
  else {
    piVar7 = tab->bits;
    lVar3 = 0;
    uVar2 = 0;
    do {
      iVar1 = tab[lVar3].blen;
      if (iVar1 == 0) {
        fwrite("Invalid VLC code\n",0x11,1,_stderr);
        return 1;
      }
      pvVar8 = tab + lVar3;
      lVar5 = 0;
      for (uVar4 = 0; (long)uVar4 < (long)iVar1; uVar4 = uVar4 + 1) {
        if (uVar4 == uVar2) {
          iVar1 = vs_u(str,(uint32_t *)((long)bit + lVar5),1);
          if (iVar1 != 0) {
            return 1;
          }
          uVar2 = (int)uVar4 + 1;
          iVar1 = pvVar8->blen;
        }
        if (bit[uVar4] != piVar7[uVar4]) break;
        lVar5 = lVar5 + 4;
      }
      lVar3 = lVar3 + 1;
      piVar7 = piVar7 + 0x22;
    } while (iVar1 != (int)uVar4);
    *val = pvVar8->val;
    local_d0 = 0;
  }
  return local_d0;
}

Assistant:

int vs_vlc(struct bitstream *str, uint32_t *val, const struct vs_vlc_val *tab) {
	if (str->dir == VS_ENCODE) {
		int i, j;
		for (i = 0; tab[i].blen; i++) {
			if (*val == tab[i].val) {
				uint32_t bit;
				for (j = 0; j < tab[i].blen; j++) {
					bit = tab[i].bits[j];
					if (vs_u(str, &bit, 1))
						return 1;
				}
				return 0;
			}
		}
		fprintf(stderr, "No VLC code for a value\n");
		return 1;
	} else {
		int i, j;
		uint32_t bit[32];
		int n = 0;
		for (i = 0; tab[i].blen; i++) {
			for (j = 0; j < tab[i].blen; j++) {
				if (j == n) {
					if (vs_u(str, &bit[j], 1)) return 1;
					n = j + 1;
				}
				if (bit[j] != tab[i].bits[j])
					break;
			}
			if (j == tab[i].blen) {
				*val = tab[i].val;
				return 0;
			}
		}
		fprintf(stderr, "Invalid VLC code\n");
		return 1;
	}
}